

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O3

void __thiscall
cbtDbvt::rayTestInternal
          (cbtDbvt *this,cbtDbvtNode *root,cbtVector3 *rayFrom,cbtVector3 *rayTo,
          cbtVector3 *rayDirectionInverse,uint *signs,cbtScalar lambda_max,cbtVector3 *aabbMin,
          cbtVector3 *aabbMax,cbtAlignedObjectArray<const_cbtDbvtNode_*> *stack,ICollide *policy)

{
  cbtDbvtNode *pcVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  cbtDbvtNode **ppcVar6;
  long lVar7;
  int i;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 local_58 [8];
  float afStack_50 [2];
  undefined1 local_48 [16];
  cbtDbvtNode **local_38;
  
  if (root != (cbtDbvtNode *)0x0) {
    lVar10 = (long)stack->m_size;
    if (lVar10 < 0x80) {
      if (stack->m_capacity < 0x80) {
        ppcVar6 = (cbtDbvtNode **)cbtAlignedAllocInternal(0x400,0x10);
        iVar8 = stack->m_size;
        if (0 < (long)iVar8) {
          lVar7 = 0;
          do {
            ppcVar6[lVar7] = stack->m_data[lVar7];
            lVar7 = lVar7 + 1;
          } while (iVar8 != lVar7);
        }
        if ((stack->m_data != (cbtDbvtNode **)0x0) && (stack->m_ownsMemory == true)) {
          cbtAlignedFreeInternal(stack->m_data);
        }
        stack->m_ownsMemory = true;
        stack->m_data = ppcVar6;
        stack->m_capacity = 0x80;
      }
      do {
        stack->m_data[lVar10] = (cbtDbvtNode *)0x0;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x80);
    }
    stack->m_size = 0x80;
    iVar8 = 1;
    iVar11 = 0x7e;
    *stack->m_data = root;
    do {
      ppcVar6 = stack->m_data;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)aabbMax->m_floats;
      iVar9 = iVar8 + -1;
      pcVar1 = ppcVar6[(long)iVar8 + -1];
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *(ulong *)(pcVar1->volume).mi.m_floats;
      auVar12 = vsubps_avx(auVar12,auVar14);
      _local_58 = vinsertps_avx(auVar12,ZEXT416((uint)((pcVar1->volume).mi.m_floats[2] -
                                                      aabbMax->m_floats[2])),0x28);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *(ulong *)(pcVar1->volume).mx.m_floats;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)aabbMin->m_floats;
      auVar12 = vsubps_avx(auVar13,auVar15);
      local_48 = vinsertps_avx(auVar12,ZEXT416((uint)((pcVar1->volume).mx.m_floats[2] -
                                                     aabbMin->m_floats[2])),0x28);
      fVar2 = (*(float *)(local_58 + (ulong)*signs * 0x10) - rayFrom->m_floats[0]) *
              rayDirectionInverse->m_floats[0];
      fVar3 = rayDirectionInverse->m_floats[1] *
              (*(float *)(local_58 + (ulong)(1 - signs[1]) * 0x10 + 4) - rayFrom->m_floats[1]);
      if (fVar2 <= fVar3) {
        fVar4 = rayDirectionInverse->m_floats[0] *
                (*(float *)(local_58 + (ulong)(1 - *signs) * 0x10) - rayFrom->m_floats[0]);
        fVar5 = (*(float *)(local_58 + (ulong)signs[1] * 0x10 + 4) - rayFrom->m_floats[1]) *
                rayDirectionInverse->m_floats[1];
        if (fVar5 <= fVar4) {
          auVar12 = vmaxss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar2));
          fVar2 = rayDirectionInverse->m_floats[2] *
                  (*(float *)(local_58 + (ulong)(1 - signs[2]) * 0x10 + 8) - rayFrom->m_floats[2]);
          if (auVar12._0_4_ <= fVar2) {
            auVar13 = vminss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar4));
            fVar3 = (*(float *)(local_58 + (ulong)signs[2] * 0x10 + 8) - rayFrom->m_floats[2]) *
                    rayDirectionInverse->m_floats[2];
            if (((fVar3 <= auVar13._0_4_) &&
                (auVar12 = vmaxss_avx(ZEXT416((uint)fVar3),auVar12), auVar12._0_4_ < lambda_max)) &&
               (auVar12 = vminss_avx(ZEXT416((uint)fVar2),auVar13), 0.0 < auVar12._0_4_)) {
              if ((pcVar1->field_2).childs[1] == (cbtDbvtNode *)0x0) {
                (*policy->_vptr_ICollide[3])(policy,pcVar1);
              }
              else {
                if (iVar11 < iVar9) {
                  iVar11 = stack->m_size;
                  lVar10 = (long)iVar11;
                  iVar9 = iVar11 * 2;
                  if (iVar11 < iVar9) {
                    if (stack->m_capacity < iVar9) {
                      if (iVar11 == 0) {
                        ppcVar6 = (cbtDbvtNode **)0x0;
                      }
                      else {
                        ppcVar6 = (cbtDbvtNode **)cbtAlignedAllocInternal(lVar10 << 4,0x10);
                        iVar11 = stack->m_size;
                        if (0 < (long)iVar11) {
                          lVar7 = 0;
                          do {
                            ppcVar6[lVar7] = stack->m_data[lVar7];
                            lVar7 = lVar7 + 1;
                          } while (iVar11 != lVar7);
                        }
                      }
                      if ((stack->m_data != (cbtDbvtNode **)0x0) && (stack->m_ownsMemory == true)) {
                        local_38 = ppcVar6;
                        cbtAlignedFreeInternal(stack->m_data);
                        ppcVar6 = local_38;
                      }
                      stack->m_ownsMemory = true;
                      stack->m_data = ppcVar6;
                      stack->m_capacity = iVar9;
                    }
                    do {
                      stack->m_data[lVar10] = (cbtDbvtNode *)0x0;
                      lVar10 = lVar10 + 1;
                    } while (iVar9 != lVar10);
                    ppcVar6 = stack->m_data;
                  }
                  iVar11 = iVar9 + -2;
                  stack->m_size = iVar9;
                }
                ppcVar6[(long)iVar8 + -1] = (pcVar1->field_2).childs[0];
                stack->m_data[iVar8] = (pcVar1->field_2).childs[1];
                iVar9 = iVar8 + 1;
              }
            }
          }
        }
      }
      iVar8 = iVar9;
    } while (iVar8 != 0);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void cbtDbvt::rayTestInternal(const cbtDbvtNode* root,
									const cbtVector3& rayFrom,
									const cbtVector3& rayTo,
									const cbtVector3& rayDirectionInverse,
									unsigned int signs[3],
									cbtScalar lambda_max,
									const cbtVector3& aabbMin,
									const cbtVector3& aabbMax,
									cbtAlignedObjectArray<const cbtDbvtNode*>& stack,
									DBVT_IPOLICY) const
{
	(void)rayTo;
	DBVT_CHECKTYPE
	if (root)
	{
		cbtVector3 resultNormal;

		int depth = 1;
		int treshold = DOUBLE_STACKSIZE - 2;
		stack.resize(DOUBLE_STACKSIZE);
		stack[0] = root;
		cbtVector3 bounds[2];
		do
		{
			const cbtDbvtNode* node = stack[--depth];
			bounds[0] = node->volume.Mins() - aabbMax;
			bounds[1] = node->volume.Maxs() - aabbMin;
			cbtScalar tmin = 1.f, lambda_min = 0.f;
			unsigned int result1 = false;
			result1 = cbtRayAabb2(rayFrom, rayDirectionInverse, signs, bounds, tmin, lambda_min, lambda_max);
			if (result1)
			{
				if (node->isinternal())
				{
					if (depth > treshold)
					{
						stack.resize(stack.size() * 2);
						treshold = stack.size() - 2;
					}
					stack[depth++] = node->childs[0];
					stack[depth++] = node->childs[1];
				}
				else
				{
					policy.Process(node);
				}
			}
		} while (depth);
	}
}